

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::initTest
          (TessellationShaderTessellationgl_TessCoord *this)

{
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *pNVar6;
  _tessellation_primitive_mode primitive_mode;
  pointer inner_tess_level;
  long lVar7;
  GLint gl_max_tess_gen_level_value;
  _tessellation_levels_set tessellation_levels;
  undefined8 local_90;
  GLint compile_status;
  size_type sStack_80;
  undefined1 local_78 [12];
  undefined8 uStack_6c;
  GLfloat local_64 [9];
  char *vs_body;
  char *fs_body;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compile_status,"Tessellation shader functionality not supported, skipping"
               ,(allocator<char> *)&tessellation_levels);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&compile_status);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (((uVar1 & 0x300) == 0) && (this->m_test_type == TESSELLATION_TEST_TYPE_TES)) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compile_status,"Test can\'t be run in ES context",
               (allocator<char> *)&tessellation_levels);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&compile_status);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6db);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6de);
  (**(code **)(lVar5 + 0x6c8))(1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e1);
  GVar4 = (**(code **)(lVar5 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_broken_ts_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6e6);
  fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&fs_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6f0);
  vs_body = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_vs_id,1,&vs_body);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x6fb);
  local_90._0_4_ = this->m_fs_id;
  local_90._4_4_ = this->m_vs_id;
  lVar7 = 0;
  do {
    if (lVar7 == 2) {
      (**(code **)(lVar5 + 0x868))((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x71a);
      for (primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
          primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
          primitive_mode = primitive_mode + TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
        TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                  (&tessellation_levels,primitive_mode,0,
                   TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
        for (inner_tess_level =
                  tessellation_levels.
                  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            inner_tess_level !=
            tessellation_levels.
            super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
            ._M_impl.super__Vector_impl_data._M_finish; inner_tess_level = inner_tess_level + 1) {
          local_78._4_4_ = 0.0;
          local_78._8_4_ = 0.0;
          uStack_6c._0_4_ = 0.0;
          uStack_6c._4_4_ = 0.0;
          local_64[0] = 0.0;
          local_64[1] = 0.0;
          _compile_status = (pointer)0x0;
          sStack_80 = 3;
          local_78._0_4_ = 0;
          local_64[2] = 2.8026e-45;
          local_64[3] = 5.60519e-45;
          local_64[4] = -NAN;
          local_64[5] = -NAN;
          initTestDescriptor(this,(_test_descriptor *)&compile_status,
                             TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,primitive_mode,1,
                             inner_tess_level->inner,inner_tess_level->outer,this->m_test_type);
          std::
          vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
          ::push_back(&this->m_tests,(_test_descriptor *)&compile_status);
        }
        std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
        ::~_Vector_base(&tessellation_levels.
                         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                       );
      }
      (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x738);
      (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBindBufferBase() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x73b);
      return;
    }
    iVar2 = *(int *)((long)&local_90 + lVar7 * 4);
    if (iVar2 != 0) {
      _compile_status = _compile_status & 0xffffffff00000000;
      (**(code **)(lVar5 + 0x248))(iVar2);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glCompileShader() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70a);
      (**(code **)(lVar5 + 0xa70))(iVar2,0x8b81,&compile_status);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x70d);
      if (compile_status != 1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x711);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	if (glu::isContextTypeES(m_context.getRenderContext().getType()) && m_test_type == TESSELLATION_TEST_TYPE_TES)
	{
		throw tcu::NotSupportedError("Test can't be run in ES context");
	}

	/* Generate all test-wide objects needed for test execution */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_broken_ts_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_fs_id		   = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id		   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			glw::GLint compile_status = GL_FALSE;

			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

			if (compile_status != GL_TRUE)
			{
				TCU_FAIL("Shader compilation failed");
			}
		}
	} /* for (all shaders) */

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we start looping */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test passes - iterate over all primitive modes supported.. */
	for (int primitive_mode = static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST);
		 primitive_mode != static_cast<int>(TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT); primitive_mode++)
	{
		/* Iterate over all tessellation level combinations defined for current primitive mode */
		_tessellation_levels_set tessellation_levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			static_cast<_tessellation_primitive_mode>(primitive_mode), gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

		for (_tessellation_levels_set_const_iterator levels_iterator = tessellation_levels.begin();
			 levels_iterator != tessellation_levels.end(); levels_iterator++)
		{
			const _tessellation_levels& levels = *levels_iterator;
			_test_descriptor			test;

			initTestDescriptor(test, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
							   static_cast<_tessellation_primitive_mode>(primitive_mode), 1, /* n_patch_vertices */
							   levels.inner, levels.outer, m_test_type);

			/* Store the test descriptor */
			m_tests.push_back(test);
		} /* for (all tessellation level combinations for current primitive mode) */
	}	 /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}